

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O1

void __thiscall
Json::BuiltStyledStreamWriter::writeValue(BuiltStyledStreamWriter *this,Value *value)

{
  pointer pbVar1;
  bool bVar2;
  ValueType VVar3;
  Json *pJVar4;
  Value *pVVar5;
  uint length;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  LargestInt value_00;
  LargestUInt value_01;
  char *pcVar7;
  pointer key;
  double value_02;
  char *str;
  char *end;
  string local_78;
  Members local_58;
  string *local_40;
  int local_38 [2];
  
  pVVar5 = value;
  VVar3 = Value::type(value);
  length = 0x12527c;
  switch(VVar3) {
  case nullValue:
    pushValue(this,&this->nullSymbol_);
    return;
  case intValue:
  case int64Value:
    pJVar4 = (Json *)Value::asLargestInt(value);
    valueToString_abi_cxx11_(&local_78,pJVar4,value_00);
    pushValue(this,&local_78);
    break;
  case uintValue:
    pJVar4 = (Json *)Value::asLargestUInt(value);
    valueToString_abi_cxx11_(&local_78,pJVar4,value_01);
    pushValue(this,&local_78);
    break;
  case realValue:
    value_02 = Value::asDouble(value);
    valueToString_abi_cxx11_(&local_78,(Json *)pVVar5,value_02);
    pushValue(this,&local_78);
    break;
  case stringValue:
    bVar2 = Value::getString(value,(char **)&local_58,(char **)local_38);
    if (bVar2) {
      valueToQuotedStringN_abi_cxx11_
                (&local_78,
                 (Json *)local_58.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                 (char *)(ulong)(uint)(local_38[0] -
                                      (int)local_58.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start),length);
      pushValue(this,&local_78);
      break;
    }
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
    pushValue(this,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) {
      return;
    }
    goto LAB_001221e0;
  case booleanValue:
    bVar2 = Value::asBool(value);
    pcVar7 = "false";
    if (bVar2) {
      pcVar7 = "true";
    }
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,pcVar7,pcVar7 + ((ulong)bVar2 ^ 5));
    pushValue(this,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) {
      return;
    }
    goto LAB_001221e0;
  case arrayValue:
    writeArrayValue(this,value);
    return;
  case objectValue:
    Value::getMemberNames_abi_cxx11_(&local_58,value);
    paVar6 = &local_78.field_2;
    local_78._M_dataplus._M_p = (pointer)paVar6;
    if (local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"{}","");
      pushValue(this,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar6) goto LAB_0012239d;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"{","");
      writeWithIndent(this,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      local_40 = &this->indentString_;
      std::__cxx11::string::_M_append((char *)local_40,(ulong)(this->indentation_)._M_dataplus._M_p)
      ;
      key = local_58.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      do {
        pVVar5 = Value::operator[](value,key);
        writeCommentBeforeValue(this,pVVar5);
        valueToQuotedStringN_abi_cxx11_
                  (&local_78,(Json *)(key->_M_dataplus)._M_p,
                   (char *)(ulong)(uint)key->_M_string_length,(uint)paVar6);
        writeWithIndent(this,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->super_StreamWriter).sout_,(this->colonSymbol_)._M_dataplus._M_p,
                   (this->colonSymbol_)._M_string_length);
        writeValue(this,pVVar5);
        pbVar1 = local_58.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        key = key + 1;
        if (key != local_58.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
          std::__ostream_insert<char,std::char_traits<char>>((this->super_StreamWriter).sout_,",",1)
          ;
        }
        writeCommentAfterValueOnSameLine(this,pVVar5);
      } while (key != pbVar1);
      std::__cxx11::string::resize
                ((ulong)local_40,
                 (char)(this->indentString_)._M_string_length -
                 (char)(this->indentation_)._M_string_length);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"}","");
      writeWithIndent(this,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
LAB_0012239d:
        operator_delete(local_78._M_dataplus._M_p);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_58);
  default:
    goto switchD_001220ef_default;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
LAB_001221e0:
    operator_delete(local_78._M_dataplus._M_p);
  }
switchD_001220ef_default:
  return;
}

Assistant:

void BuiltStyledStreamWriter::writeValue(Value const& value) {
  switch (value.type()) {
  case nullValue:
    pushValue(nullSymbol_);
    break;
#if defined(JSON_HAS_INT64)
  case int64Value:
#endif
  case intValue:
    pushValue(valueToString(value.asLargestInt()));
    break;
  case uintValue:
    pushValue(valueToString(value.asLargestUInt()));
    break;
  case realValue:
    pushValue(valueToString(value.asDouble()));
    break;
  case stringValue:
  {
    // Is NULL is possible for value.string_?
    char const* str;
    char const* end;
    bool ok = value.getString(&str, &end);
    if (ok) pushValue(valueToQuotedStringN(str, static_cast<unsigned>(end-str)));
    else pushValue("");
    break;
  }
  case booleanValue:
    pushValue(valueToString(value.asBool()));
    break;
  case arrayValue:
    writeArrayValue(value);
    break;
  case objectValue: {
    Value::Members members(value.getMemberNames());
    if (members.empty())
      pushValue("{}");
    else {
      writeWithIndent("{");
      indent();
      Value::Members::iterator it = members.begin();
      for (;;) {
        std::string const& name = *it;
        Value const& childValue = value[name];
        writeCommentBeforeValue(childValue);
        writeWithIndent(valueToQuotedStringN(name.data(), name.length()));
        *sout_ << colonSymbol_;
        writeValue(childValue);
        if (++it == members.end()) {
          writeCommentAfterValueOnSameLine(childValue);
          break;
        }
        *sout_ << ",";
        writeCommentAfterValueOnSameLine(childValue);
      }
      unindent();
      writeWithIndent("}");
    }
  } break;
  }
}